

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O2

int __thiscall luna::Lexer::LexNumber(Lexer *this,TokenDetail *detail)

{
  uint uVar1;
  int iVar2;
  char cVar3;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  function<bool_(int)> local_58;
  
  (this->token_buffer_)._M_string_length = 0;
  *(this->token_buffer_)._M_dataplus._M_p = '\0';
  iVar2 = this->current_;
  if (iVar2 == 0x30) {
    cVar3 = (char)this + '@';
    uVar1 = Next(this);
    std::__cxx11::string::push_back(cVar3);
    if ((uVar1 & 0xffffffdf) == 0x58) {
      std::__cxx11::string::push_back(cVar3);
      iVar2 = Next(this);
      this->current_ = iVar2;
      local_58.super__Function_base._M_functor._8_8_ = 0;
      local_58.super__Function_base._M_functor._M_unused._M_object =
           anon_unknown.dwarf_c96e2::IsHexChar;
      local_58._M_invoker = std::_Function_handler<bool_(int),_bool_(*)(int)>::_M_invoke;
      local_58.super__Function_base._M_manager =
           std::_Function_handler<bool_(int),_bool_(*)(int)>::_M_manager;
      local_78._M_unused._M_object = (void *)0x0;
      local_78._8_8_ = 0;
      local_60 = std::
                 _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Lex.cpp:268:35)>
                 ::_M_invoke;
      local_68 = std::
                 _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Lex.cpp:268:35)>
                 ::_M_manager;
      LexNumberX(this,detail,false,&local_58,(function<bool_(int)> *)&local_78);
      goto LAB_001400b7;
    }
    this->current_ = uVar1;
  }
  local_58.super__Function_base._M_functor._M_unused._M_object = (code *)0x0;
  local_58.super__Function_base._M_functor._8_8_ = 0;
  local_58._M_invoker =
       std::
       _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Lex.cpp:279:27)>
       ::_M_invoke;
  local_58.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Lex.cpp:279:27)>
       ::_M_manager;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Lex.cpp:280:27)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Lex.cpp:280:27)>
             ::_M_manager;
  LexNumberX(this,detail,iVar2 == 0x30,&local_58,(function<bool_(int)> *)&local_78);
LAB_001400b7:
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  std::_Function_base::~_Function_base(&local_58.super__Function_base);
  return 0x117;
}

Assistant:

int Lexer::LexNumber(TokenDetail *detail)
    {
        bool integer_part = false;
        token_buffer_.clear();
        if (current_ == '0')
        {
            int next = Next();
            if (next == 'x' || next == 'X')
            {
                token_buffer_.push_back(current_);
                token_buffer_.push_back(next);
                current_ = Next();

                return LexNumberX(detail, false, IsHexChar,
                                  [](int c) { return c == 'p' || c == 'P'; });
            }
            else
            {
                token_buffer_.push_back(current_);
                current_ = next;
                integer_part = true;
            }
        }

        return LexNumberX(detail, integer_part,
                          [](int c) { return isdigit(c) != 0; },
                          [](int c) { return c == 'e' || c == 'E'; });
    }